

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O2

bool __thiscall DelayImpEntryWrapper::loadNextEntry(DelayImpEntryWrapper *this,size_t entryNum)

{
  ExeNodeWrapper *pEVar1;
  int iVar2;
  DelayImpFuncWrapper *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  bool bVar4;
  bool isOk;
  DelayImpFuncWrapper *local_28;
  
  this_00 = (DelayImpFuncWrapper *)operator_new(0x50);
  DelayImpFuncWrapper::DelayImpFuncWrapper
            (this_00,(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.m_PE,this,entryNum);
  iVar2 = (*(this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this_00)
  ;
  if (CONCAT44(extraout_var,iVar2) == 0) {
    (*(this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])(this_00);
    bVar4 = false;
  }
  else {
    isOk = false;
    iVar2 = (*(this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                      (this_00,0,0xffffffffffffffff,&isOk);
    bVar4 = (bool)(CONCAT44(extraout_var_00,iVar2) - 1U < 0xfffffffffffffffe & isOk);
    if (bVar4 == false) {
      (*(this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
        super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])(this_00);
    }
    else {
      local_28 = this_00;
      std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                 &(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                  entries,(ExeNodeWrapper **)&local_28);
      pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               parentNode;
      if (pEVar1 != (ExeNodeWrapper *)0x0) {
        plVar3 = (long *)__dynamic_cast(pEVar1,&ExeNodeWrapper::typeinfo,
                                        &DelayImpDirWrapper::typeinfo,0);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x168))(plVar3,this_00);
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool DelayImpEntryWrapper::loadNextEntry(size_t entryNum)
 {
    DelayImpFuncWrapper* entry = new DelayImpFuncWrapper(this->m_PE, this, entryNum);
    if (entry->getPtr() == NULL) {
        delete entry;
        return false;
    }
    bool isOk = false;
    uint64_t thunk = entry->getNumValue(DelayImpFuncWrapper::NAMETHUNK_ADDR, &isOk);
    if (!isOk || thunk == INVALID_ADDR || thunk == 0) {
        delete entry;
        return false;
    }
    this->entries.push_back(entry);

    DelayImpDirWrapper *impDir = dynamic_cast<DelayImpDirWrapper*>(this->parentNode);
    if (impDir) impDir->addMapping(entry);
    return true;
 }